

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O0

void __thiscall kj::parse::anon_unknown_0::TestCase126::run(TestCase126 *this)

{
  char **this_00;
  bool bVar1;
  char *begin;
  char *end;
  Any_ *in_RDX;
  parse *in_RSI;
  bool local_66;
  bool local_65;
  bool _kj_shouldLog_1;
  bool _kj_shouldLog;
  Maybe<kj::_::Tuple<>_> local_52;
  undefined1 local_50 [6];
  Maybe<kj::_::Tuple<>_> result;
  Input input;
  StringPtr text;
  ConstResult_<const_kj::parse::Any__&,_kj::_::Tuple<>_> parser;
  TestCase126 *this_local;
  
  text.content.size_ =
       (size_t)discard<kj::parse::Any_const&>
                         ((ConstResult_<const_kj::parse::Any__&,_kj::_::Tuple<>_> *)&any,in_RSI,
                          in_RDX);
  this_00 = &input.best;
  StringPtr::StringPtr((StringPtr *)this_00,"o");
  begin = StringPtr::begin((StringPtr *)this_00);
  end = StringPtr::end((StringPtr *)this_00);
  IteratorInput<char,_const_char_*>::IteratorInput
            ((IteratorInput<char,_const_char_*> *)local_50,begin,end);
  ConstResult_<kj::parse::Any_const&,kj::_::Tuple<>>::operator()
            ((ConstResult_<kj::parse::Any_const&,kj::_::Tuple<>> *)&local_52,
             (IteratorInput<char,_const_char_*> *)&text.content.size_);
  bVar1 = Maybe<kj::_::Tuple<>_>::operator!=(&local_52,(void *)0x0);
  if (!bVar1) {
    local_65 = kj::_::Debug::shouldLog(ERROR);
    while (local_65 != false) {
      kj::_::Debug::log<char_const(&)[35]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x84,ERROR,"\"failed: expected \" \"result != nullptr\"",
                 (char (*) [35])"failed: expected result != nullptr");
      local_65 = false;
    }
  }
  bVar1 = IteratorInput<char,_const_char_*>::atEnd((IteratorInput<char,_const_char_*> *)local_50);
  if (!bVar1) {
    local_66 = kj::_::Debug::shouldLog(ERROR);
    while (local_66 != false) {
      kj::_::Debug::log<char_const(&)[31]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x85,ERROR,"\"failed: expected \" \"input.atEnd()\"",
                 (char (*) [31])"failed: expected input.atEnd()");
      local_66 = false;
    }
  }
  Maybe<kj::_::Tuple<>_>::~Maybe(&local_52);
  IteratorInput<char,_const_char_*>::~IteratorInput((IteratorInput<char,_const_char_*> *)local_50);
  return;
}

Assistant:

TEST(CommonParsers, DiscardParser) {
  auto parser = discard(any);

  StringPtr text = "o";
  Input input(text.begin(), text.end());
  Maybe<Tuple<>> result = parser(input);
  EXPECT_TRUE(result != nullptr);
  EXPECT_TRUE(input.atEnd());
}